

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

void * lj_alloc_free(void *msp,void *ptr)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint *puVar9;
  ulong *puVar10;
  byte bVar11;
  long in_RSI;
  uint *in_RDI;
  bool bVar12;
  tchunkptr F_5;
  tchunkptr *C;
  size_t K_1;
  tchunkptr T;
  uint K;
  uint X;
  bindex_t I_3;
  tbinptr *H_2;
  tchunkptr tp;
  mchunkptr F_4;
  mchunkptr B_2;
  bindex_t I_2;
  tchunkptr C1_1;
  tchunkptr C0_1;
  tbinptr *H_1;
  tchunkptr *CP_1;
  tchunkptr *RP_1;
  tchunkptr F_3;
  tchunkptr R_1;
  tchunkptr XP_1;
  tchunkptr TP_1;
  bindex_t I_1;
  mchunkptr B_1;
  mchunkptr F_2;
  size_t nsize;
  size_t dsize;
  size_t tsize;
  tchunkptr C1;
  tchunkptr C0;
  tbinptr *H;
  tchunkptr *CP;
  tchunkptr *RP;
  tchunkptr F_1;
  tchunkptr R;
  tchunkptr XP;
  tchunkptr TP;
  bindex_t I;
  mchunkptr B;
  mchunkptr F;
  mchunkptr prev;
  size_t prevsize;
  mchunkptr next;
  size_t psize;
  mstate fm;
  mchunkptr p;
  byte local_190;
  size_t in_stack_fffffffffffffe78;
  undefined6 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe86;
  undefined1 in_stack_fffffffffffffe87;
  size_t in_stack_fffffffffffffe88;
  mstate in_stack_fffffffffffffe90;
  long local_168;
  ulong local_160;
  ulong local_150;
  uint *local_138;
  long *local_108;
  long *local_100;
  long local_f0;
  mstate in_stack_ffffffffffffff60;
  ulong *local_90;
  ulong *local_88;
  ulong local_78;
  ulong local_30;
  ulong *local_20;
  
  if (in_RSI == 0) {
    return (void *)0x0;
  }
  local_20 = (ulong *)(in_RSI + -0x10);
  local_30 = *(ulong *)(in_RSI + -8) & 0xfffffffffffffffc;
  lVar8 = (long)local_20 + local_30;
  if ((*(ulong *)(in_RSI + -8) & 1) == 0) {
    uVar1 = *local_20;
    if ((uVar1 & 1) != 0) {
      CALL_MUNMAP((void *)CONCAT17(in_stack_fffffffffffffe87,
                                   CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)),
                  in_stack_fffffffffffffe78);
      return (void *)0x0;
    }
    local_20 = (ulong *)((long)local_20 - uVar1);
    local_30 = uVar1 + local_30;
    if (local_20 == *(ulong **)(in_RDI + 6)) {
      if ((*(ulong *)(lVar8 + 8) & 3) == 3) {
        *(ulong *)(in_RDI + 2) = local_30;
        *(ulong *)(lVar8 + 8) = *(ulong *)(lVar8 + 8) & 0xfffffffffffffffe;
        local_20[1] = local_30 | 1;
        *(ulong *)((long)local_20 + local_30) = local_30;
        return (void *)0x0;
      }
    }
    else if (uVar1 >> 3 < 0x20) {
      uVar2 = local_20[2];
      uVar3 = local_20[3];
      if (uVar2 == uVar3) {
        *in_RDI = (1 << ((byte)(uVar1 >> 3) & 0x1f) ^ 0xffffffffU) & *in_RDI;
      }
      else {
        *(ulong *)(uVar2 + 0x18) = uVar3;
        *(ulong *)(uVar3 + 0x10) = uVar2;
      }
    }
    else {
      uVar1 = local_20[6];
      if ((ulong *)local_20[3] == local_20) {
        local_88 = local_20 + 5;
        local_78 = local_20[5];
        if (local_78 == 0) {
          local_88 = local_20 + 4;
          local_78 = local_20[4];
          if (local_78 == 0) goto LAB_0015a7ce;
        }
        while( true ) {
          local_90 = (ulong *)(local_78 + 0x28);
          bVar12 = true;
          if (*(long *)(local_78 + 0x28) == 0) {
            local_90 = (ulong *)(local_78 + 0x20);
            bVar12 = *(long *)(local_78 + 0x20) != 0;
          }
          if (!bVar12) break;
          local_88 = local_90;
          local_78 = *local_90;
        }
        *local_88 = 0;
      }
      else {
        uVar2 = local_20[2];
        local_78 = local_20[3];
        *(ulong *)(uVar2 + 0x18) = local_78;
        *(ulong *)(local_78 + 0x10) = uVar2;
      }
LAB_0015a7ce:
      if (uVar1 != 0) {
        if (local_20 == *(ulong **)(in_RDI + local_20[7] * 2 + 0x92)) {
          *(ulong *)(in_RDI + local_20[7] * 2 + 0x92) = local_78;
          if (local_78 == 0) {
            in_RDI[1] = (1 << ((byte)local_20[7] & 0x1f) ^ 0xffffffffU) & in_RDI[1];
          }
        }
        else if (*(ulong **)(uVar1 + 0x20) == local_20) {
          *(ulong *)(uVar1 + 0x20) = local_78;
        }
        else {
          *(ulong *)(uVar1 + 0x28) = local_78;
        }
        if (local_78 != 0) {
          *(ulong *)(local_78 + 0x30) = uVar1;
          in_stack_ffffffffffffff60 = (mstate)local_20[4];
          if (in_stack_ffffffffffffff60 != (mstate)0x0) {
            *(mstate *)(local_78 + 0x20) = in_stack_ffffffffffffff60;
            in_stack_ffffffffffffff60->release_checks = local_78;
          }
          uVar1 = local_20[5];
          if (uVar1 != 0) {
            *(ulong *)(local_78 + 0x28) = uVar1;
            *(ulong *)(uVar1 + 0x30) = local_78;
          }
        }
      }
    }
  }
  if ((*(ulong *)(lVar8 + 8) & 2) != 0) {
    *(ulong *)(lVar8 + 8) = *(ulong *)(lVar8 + 8) & 0xfffffffffffffffe;
    local_20[1] = local_30 | 1;
    *(ulong *)((long)local_20 + local_30) = local_30;
    goto LAB_0015afde;
  }
  if (lVar8 == *(long *)(in_RDI + 8)) {
    local_30 = local_30 + *(long *)(in_RDI + 4);
    *(ulong *)(in_RDI + 4) = local_30;
    *(ulong **)(in_RDI + 8) = local_20;
    local_20[1] = local_30 | 1;
    if (local_20 == *(ulong **)(in_RDI + 6)) {
      in_RDI[6] = 0;
      in_RDI[7] = 0;
      in_RDI[2] = 0;
      in_RDI[3] = 0;
    }
    if (local_30 <= *(ulong *)(in_RDI + 10)) {
      return (void *)0x0;
    }
    alloc_trim(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    return (void *)0x0;
  }
  if (lVar8 == *(long *)(in_RDI + 6)) {
    local_30 = local_30 + *(long *)(in_RDI + 2);
    *(ulong *)(in_RDI + 2) = local_30;
    *(ulong **)(in_RDI + 6) = local_20;
    local_20[1] = local_30 | 1;
    *(ulong *)((long)local_20 + local_30) = local_30;
    return (void *)0x0;
  }
  uVar1 = *(ulong *)(lVar8 + 8);
  local_30 = (uVar1 & 0xfffffffffffffffc) + local_30;
  if (uVar1 >> 3 < 0x20) {
    lVar4 = *(long *)(lVar8 + 0x10);
    lVar8 = *(long *)(lVar8 + 0x18);
    if (lVar4 == lVar8) {
      *in_RDI = (1 << ((byte)(uVar1 >> 3) & 0x1f) ^ 0xffffffffU) & *in_RDI;
    }
    else {
      *(long *)(lVar4 + 0x18) = lVar8;
      *(long *)(lVar8 + 0x10) = lVar4;
    }
  }
  else {
    lVar4 = *(long *)(lVar8 + 0x30);
    if (*(long *)(lVar8 + 0x18) == lVar8) {
      local_100 = (long *)(lVar8 + 0x28);
      local_f0 = *(long *)(lVar8 + 0x28);
      if (local_f0 == 0) {
        local_100 = (long *)(lVar8 + 0x20);
        local_f0 = *(long *)(lVar8 + 0x20);
        if (local_f0 == 0) goto LAB_0015adab;
      }
      while( true ) {
        local_108 = (long *)(local_f0 + 0x28);
        bVar12 = true;
        if (*(long *)(local_f0 + 0x28) == 0) {
          local_108 = (long *)(local_f0 + 0x20);
          bVar12 = *(long *)(local_f0 + 0x20) != 0;
        }
        if (!bVar12) break;
        local_100 = local_108;
        local_f0 = *local_108;
      }
      *local_100 = 0;
    }
    else {
      lVar5 = *(long *)(lVar8 + 0x10);
      local_f0 = *(long *)(lVar8 + 0x18);
      *(long *)(lVar5 + 0x18) = local_f0;
      *(long *)(local_f0 + 0x10) = lVar5;
    }
LAB_0015adab:
    if (lVar4 != 0) {
      if (lVar8 == *(long *)(in_RDI + *(long *)(lVar8 + 0x38) * 2 + 0x92)) {
        *(long *)(in_RDI + *(long *)(lVar8 + 0x38) * 2 + 0x92) = local_f0;
        if (local_f0 == 0) {
          in_RDI[1] = (1 << ((byte)*(undefined8 *)(lVar8 + 0x38) & 0x1f) ^ 0xffffffffU) & in_RDI[1];
        }
      }
      else if (*(long *)(lVar4 + 0x20) == lVar8) {
        *(long *)(lVar4 + 0x20) = local_f0;
      }
      else {
        *(long *)(lVar4 + 0x28) = local_f0;
      }
      if (local_f0 != 0) {
        *(long *)(local_f0 + 0x30) = lVar4;
        lVar4 = *(long *)(lVar8 + 0x20);
        if (lVar4 != 0) {
          *(long *)(local_f0 + 0x20) = lVar4;
          *(long *)(lVar4 + 0x30) = local_f0;
        }
        lVar8 = *(long *)(lVar8 + 0x28);
        if (lVar8 != 0) {
          *(long *)(local_f0 + 0x28) = lVar8;
          *(long *)(lVar8 + 0x30) = local_f0;
        }
      }
    }
  }
  local_20[1] = local_30 | 1;
  *(ulong *)((long)local_20 + local_30) = local_30;
  if (local_20 == *(ulong **)(in_RDI + 6)) {
    *(ulong *)(in_RDI + 2) = local_30;
    return (void *)0x0;
  }
LAB_0015afde:
  if (local_30 >> 3 < 0x20) {
    puVar9 = in_RDI + (local_30 >> 3) * 4 + 0xe;
    bVar11 = (byte)(local_30 >> 3);
    if ((*in_RDI & 1 << (bVar11 & 0x1f)) == 0) {
      *in_RDI = 1 << (bVar11 & 0x1f) | *in_RDI;
      local_138 = puVar9;
    }
    else {
      local_138 = *(uint **)(puVar9 + 4);
    }
    *(ulong **)(puVar9 + 4) = local_20;
    *(ulong **)(local_138 + 6) = local_20;
    local_20[2] = (ulong)local_138;
    local_20[3] = (ulong)puVar9;
  }
  else {
    uVar7 = (uint)(local_30 >> 8);
    if (uVar7 == 0) {
      local_150 = 0;
    }
    else if (uVar7 < 0x10000) {
      iVar6 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      local_150 = (ulong)(uint)(iVar6 << 1) + (local_30 >> ((char)iVar6 + 7U & 0x3f) & 1);
    }
    else {
      local_150 = 0x1f;
    }
    puVar10 = (ulong *)(in_RDI + local_150 * 2 + 0x92);
    local_20[7] = local_150;
    local_20[5] = 0;
    local_20[4] = 0;
    if ((in_RDI[1] & 1 << ((byte)local_150 & 0x1f)) == 0) {
      in_RDI[1] = 1 << ((byte)local_150 & 0x1f) | in_RDI[1];
      *puVar10 = (ulong)local_20;
      local_20[6] = (ulong)puVar10;
      local_20[3] = (ulong)local_20;
      local_20[2] = (ulong)local_20;
    }
    else {
      local_160 = *puVar10;
      if (local_150 == 0x1f) {
        local_190 = 0;
      }
      else {
        local_190 = 0x3f - ((char)(local_150 >> 1) + '\x06');
      }
      local_168 = local_30 << (local_190 & 0x3f);
      while ((*(ulong *)(local_160 + 8) & 0xfffffffffffffffc) != local_30) {
        puVar10 = (ulong *)(local_160 + 0x20 + (local_168 >> 0x3f) * -8);
        local_168 = local_168 << 1;
        if (*puVar10 == 0) {
          *puVar10 = (ulong)local_20;
          local_20[6] = local_160;
          local_20[3] = (ulong)local_20;
          local_20[2] = (ulong)local_20;
          goto LAB_0015b348;
        }
        local_160 = *puVar10;
      }
      uVar1 = *(ulong *)(local_160 + 0x10);
      *(ulong **)(uVar1 + 0x18) = local_20;
      *(ulong **)(local_160 + 0x10) = local_20;
      local_20[2] = uVar1;
      local_20[3] = local_160;
      local_20[6] = 0;
    }
LAB_0015b348:
    lVar8 = *(long *)(in_RDI + 0xc);
    *(long *)(in_RDI + 0xc) = lVar8 + -1;
    if (lVar8 + -1 == 0) {
      release_unused_segments(in_stack_ffffffffffffff60);
    }
  }
  return (void *)0x0;
}

Assistant:

static LJ_NOINLINE void *lj_alloc_free(void *msp, void *ptr)
{
  if (ptr != 0) {
    mchunkptr p = mem2chunk(ptr);
    mstate fm = (mstate)msp;
    size_t psize = chunksize(p);
    mchunkptr next = chunk_plus_offset(p, psize);
    if (!pinuse(p)) {
      size_t prevsize = p->prev_foot;
      if ((prevsize & IS_DIRECT_BIT) != 0) {
	prevsize &= ~IS_DIRECT_BIT;
	psize += prevsize + DIRECT_FOOT_PAD;
	CALL_MUNMAP((char *)p - prevsize, psize);
	return NULL;
      } else {
	mchunkptr prev = chunk_minus_offset(p, prevsize);
	psize += prevsize;
	p = prev;
	/* consolidate backward */
	if (p != fm->dv) {
	  unlink_chunk(fm, p, prevsize);
	} else if ((next->head & INUSE_BITS) == INUSE_BITS) {
	  fm->dvsize = psize;
	  set_free_with_pinuse(p, psize, next);
	  return NULL;
	}
      }
    }
    if (!cinuse(next)) {  /* consolidate forward */
      if (next == fm->top) {
	size_t tsize = fm->topsize += psize;
	fm->top = p;
	p->head = tsize | PINUSE_BIT;
	if (p == fm->dv) {
	  fm->dv = 0;
	  fm->dvsize = 0;
	}
	if (tsize > fm->trim_check)
	  alloc_trim(fm, 0);
	return NULL;
      } else if (next == fm->dv) {
	size_t dsize = fm->dvsize += psize;
	fm->dv = p;
	set_size_and_pinuse_of_free_chunk(p, dsize);
	return NULL;
      } else {
	size_t nsize = chunksize(next);
	psize += nsize;
	unlink_chunk(fm, next, nsize);
	set_size_and_pinuse_of_free_chunk(p, psize);
	if (p == fm->dv) {
	  fm->dvsize = psize;
	  return NULL;
	}
      }
    } else {
      set_free_with_pinuse(p, psize, next);
    }

    if (is_small(psize)) {
      insert_small_chunk(fm, p, psize);
    } else {
      tchunkptr tp = (tchunkptr)p;
      insert_large_chunk(fm, tp, psize);
      if (--fm->release_checks == 0)
	release_unused_segments(fm);
    }
  }
  return NULL;
}